

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall
CVmObjIterLookupTable::get_cur_entry(CVmObjIterLookupTable *this,vm_val_t *valp,vm_val_t *keyp)

{
  ushort uVar1;
  char *buf;
  uint *puVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vm_val_t coll;
  vm_val_t local_28;
  
  buf = (this->super_CVmObjIter).super_CVmObject.ext_;
  local_28.typ = (vm_datatype_t)*buf;
  vmb_get_dh_val(buf,&local_28);
  uVar1 = *(ushort *)((this->super_CVmObjIter).super_CVmObject.ext_ + 5);
  if (uVar1 != 0) {
    puVar2 = *(uint **)((long)&G_obj_table_X.pages_[local_28.val.obj >> 0xc]
                               [local_28.val.obj & 0xfff].ptr_ + 8);
    if ((uint)uVar1 <= puVar2[1]) {
      uVar5 = (ulong)(uVar1 - 1);
      if (puVar2[(ulong)*puVar2 * 2 + uVar5 * 10 + 8] != 0xd) {
        uVar6 = (ulong)*puVar2;
        if (valp != (vm_val_t *)0x0) {
          uVar4 = (puVar2 + uVar6 * 2 + uVar5 * 10 + 0xc)[1];
          aVar3 = *(anon_union_8_8_cb74652f_for_val *)(puVar2 + uVar6 * 2 + uVar5 * 10 + 0xe);
          valp->typ = (puVar2 + uVar6 * 2 + uVar5 * 10 + 0xc)[0];
          *(uint *)&valp->field_0x4 = uVar4;
          valp->val = aVar3;
        }
        if (keyp != (vm_val_t *)0x0) {
          uVar4 = (puVar2 + uVar6 * 2 + uVar5 * 10 + 8)[1];
          aVar3 = *(anon_union_8_8_cb74652f_for_val *)(puVar2 + uVar6 * 2 + uVar5 * 10 + 10);
          keyp->typ = (puVar2 + uVar6 * 2 + uVar5 * 10 + 8)[0];
          *(uint *)&keyp->field_0x4 = uVar4;
          keyp->val = aVar3;
        }
        return;
      }
    }
  }
  err_throw(0x7eb);
}

Assistant:

void CVmObjIterLookupTable::get_cur_entry(VMG_ vm_val_t *valp,
                                          vm_val_t *keyp) const
{
    uint entry;
    vm_val_t coll;
    CVmObjLookupTable *ltab;
    vm_lookup_val *entryp;

    /* get my collection object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* make sure the index is in range */
    entry = get_entry_index();
    if (entry < 1 || entry > ltab->get_entry_count())
        err_throw(VMERR_OUT_OF_RANGE);

    /* translate our 1-based index to an entry pointer */
    entryp = ltab->get_ext()->idx_to_val(entry - 1);

    /* if the current entry has been deleted, we have no valid current item */
    if (entryp->key.typ == VM_EMPTY)
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve this entry's value and key for the caller, as desired */
    if (valp != 0)
        *valp = entryp->val;
    if (keyp != 0)
        *keyp = entryp->key;
}